

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

bool __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
::find_impl<unsigned_long>
          (raw_hash_set<phmap::priv::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
           *this,key_arg<unsigned_long> *key,size_t hashval,size_t *offset)

{
  bool bVar1;
  uint32_t uVar2;
  size_t sVar3;
  size_t *in_RCX;
  size_t in_RDX;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  *in_RSI;
  EqualElement<unsigned_long> *in_RDI;
  uint32_t i;
  BitMask<unsigned_int,_16,_0> __end4;
  BitMask<unsigned_int,_16,_0> __begin4;
  BitMask<unsigned_int,_16,_0> *__range4;
  Group g;
  probe_seq<16UL> seq;
  pair<const_unsigned_long,_unsigned_long> *ts;
  undefined4 in_stack_ffffffffffffff78;
  BitMask<unsigned_int,_16,_0> in_stack_ffffffffffffff7c;
  h2_t hash;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  *in_stack_ffffffffffffff80;
  BitMask<unsigned_int,_16,_0> local_6c;
  BitMask<unsigned_int,_16,_0> local_68;
  BitMask<unsigned_int,_16,_0> local_64;
  BitMask<unsigned_int,_16,_0> *local_60;
  GroupSse2Impl local_58;
  probe_seq<16UL> local_40;
  size_t *local_28;
  size_t local_20;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  *local_18;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  probe(in_stack_ffffffffffffff80,
        CONCAT44(in_stack_ffffffffffffff7c.mask_,in_stack_ffffffffffffff78));
  do {
    hash = (h2_t)(in_stack_ffffffffffffff7c.mask_ >> 0x18);
    ts = (pair<const_unsigned_long,_unsigned_long> *)in_RDI->rhs;
    sVar3 = probe_seq<16UL>::offset(&local_40);
    GroupSse2Impl::GroupSse2Impl(&local_58,(ctrl_t *)((long)&ts->first + sVar3));
    H2(local_20);
    local_64 = GroupSse2Impl::Match((GroupSse2Impl *)in_stack_ffffffffffffff80,hash);
    local_60 = &local_64;
    local_68 = BitMask<unsigned_int,_16,_0>::begin(local_60);
    local_6c = BitMask<unsigned_int,_16,_0>::end((BitMask<unsigned_int,_16,_0> *)ts);
    while (bVar1 = priv::operator!=(&local_68,&local_6c), bVar1) {
      uVar2 = BitMask<unsigned_int,_16,_0>::operator*((BitMask<unsigned_int,_16,_0> *)0x2e38c7);
      sVar3 = probe_seq<16UL>::offset(&local_40,(ulong)uVar2);
      *local_28 = sVar3;
      in_stack_ffffffffffffff80 = local_18;
      eq_ref((raw_hash_set<phmap::priv::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
              *)0x2e38fd);
      hash_policy_traits<phmap::priv::FlatHashMapPolicy<unsigned_long,unsigned_long>,void>::
      element<phmap::priv::FlatHashMapPolicy<unsigned_long,unsigned_long>>((slot_type *)0x2e3922);
      bVar1 = hash_policy_traits<phmap::priv::FlatHashMapPolicy<unsigned_long,unsigned_long>,void>::
              apply<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<unsigned_long,unsigned_long>,phmap::Hash<unsigned_long>,phmap::EqualTo<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>::EqualElement<unsigned_long>,std::pair<unsigned_long_const,unsigned_long>&,phmap::priv::FlatHashMapPolicy<unsigned_long,unsigned_long>>
                        (in_RDI,ts);
      if (bVar1) {
        return true;
      }
      BitMask<unsigned_int,_16,_0>::operator++(&local_68);
    }
    in_stack_ffffffffffffff7c = GroupSse2Impl::MatchEmpty((GroupSse2Impl *)ts);
    bVar1 = BitMask::operator_cast_to_bool((BitMask *)&stack0xffffffffffffff7c);
    if (bVar1) {
      return false;
    }
    probe_seq<16UL>::next(&local_40);
  } while( true );
}

Assistant:

bool find_impl(const key_arg<K>& key, size_t hashval, size_t& offset)
			{
				auto seq = probe(hashval);
				while (true) {
					Group g{ ctrl_ + seq.offset() };
					for (uint32_t i : g.Match((h2_t)H2(hashval))) {
						offset = seq.offset((size_t)i);
						if (PHMAP_PREDICT_TRUE(PolicyTraits::apply(
						                           EqualElement<K> {key, eq_ref()},
						                           PolicyTraits::element(slots_ + offset))))
							return true;
					}
					if (PHMAP_PREDICT_TRUE(g.MatchEmpty()))
						return false;
					seq.next();
				}
			}